

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# binds.cpp
# Opt level: O3

char * CBinds::GetModifierName(int m)

{
  if (m - 1U < 3) {
    return (&PTR_anon_var_dwarf_3da52_00211a30)[m - 1U];
  }
  return "";
}

Assistant:

const char *CBinds::GetModifierName(int m)
{
	switch(m)
	{
		case 0:
			return "";
		case MODIFIER_SHIFT:
			return "shift+";
		case MODIFIER_CTRL:
			return "ctrl+";
		case MODIFIER_ALT:
			return "alt+";
		default:
			return "";
	}
}